

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

s32 __thiscall
irr::core::array<irr::CIrrDeviceSDL::SKeyMap>::binary_search
          (array<irr::CIrrDeviceSDL::SKeyMap> *this,SKeyMap *element,s32 left,s32 right)

{
  pointer pSVar1;
  pointer pSVar2;
  s32 sVar3;
  pointer pSVar4;
  ulong uVar5;
  difference_type __d;
  long lVar6;
  ulong uVar7;
  
  sVar3 = -1;
  if (left <= right) {
    pSVar1 = (this->m_data).
             super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)left;
    pSVar4 = pSVar1 + lVar6;
    uVar5 = right - lVar6;
    if (uVar5 != 0 && lVar6 <= right) {
      do {
        uVar7 = uVar5 >> 1;
        uVar5 = ~uVar7 + uVar5;
        pSVar2 = pSVar4 + uVar7 + 1;
        if (element->SDLKey <= pSVar4[uVar7].SDLKey) {
          uVar5 = uVar7;
          pSVar2 = pSVar4;
        }
        pSVar4 = pSVar2;
      } while (0 < (long)uVar5);
    }
    sVar3 = -1;
    if (element->SDLKey == pSVar4->SDLKey) {
      sVar3 = (s32)((ulong)((long)pSVar4 - (long)pSVar1) >> 3);
    }
  }
  return sVar3;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}